

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_create_from_dense(Integer g_a,Integer idx_size,Integer trans)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  Integer IVar13;
  long lVar14;
  logical lVar15;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer _jdx_13;
  Integer _idx_13;
  int64_t _ld_13;
  int64_t _jj_13;
  int64_t _ii_13;
  double _val_13 [2];
  double *_ptr_13;
  Integer _jdx_12;
  Integer _idx_12;
  int64_t _ld_12;
  int64_t _jj_12;
  int64_t _ii_12;
  float _val_12 [2];
  float *_ptr_12;
  Integer _jdx_11;
  Integer _idx_11;
  int64_t _ld_11;
  int64_t _jj_11;
  int64_t _ii_11;
  double _val_11;
  double *_ptr_11;
  Integer _jdx_10;
  Integer _idx_10;
  int64_t _ld_10;
  int64_t _jj_10;
  int64_t _ii_10;
  float _val_10;
  float *_ptr_10;
  Integer _jdx_9;
  Integer _idx_9;
  int64_t _ld_9;
  int64_t _jj_9;
  int64_t _ii_9;
  longlong _val_9;
  longlong *_ptr_9;
  Integer _jdx_8;
  Integer _idx_8;
  int64_t _ld_8;
  int64_t _jj_8;
  int64_t _ii_8;
  long _val_8;
  long *_ptr_8;
  Integer _jdx_7;
  Integer _idx_7;
  int64_t _ld_7;
  int64_t _jj_7;
  int64_t _ii_7;
  int _val_7;
  int *_ptr_7;
  Integer _jdx_6;
  Integer _idx_6;
  int _ld_6;
  int _jj_6;
  int _ii_6;
  double _val_6 [2];
  double *_ptr_6;
  Integer _jdx_5;
  Integer _idx_5;
  int _ld_5;
  int _jj_5;
  int _ii_5;
  float _val_5 [2];
  float *_ptr_5;
  Integer _jdx_4;
  Integer _idx_4;
  int _ld_4;
  int _jj_4;
  int _ii_4;
  double _val_4;
  double *_ptr_4;
  Integer _jdx_3;
  Integer _idx_3;
  int _ld_3;
  int _jj_3;
  int _ii_3;
  float _val_3;
  float *_ptr_3;
  Integer _jdx_2;
  Integer _idx_2;
  int _ld_2;
  int _jj_2;
  int _ii_2;
  longlong _val_2;
  longlong *_ptr_2;
  Integer _jdx_1;
  Integer _idx_1;
  int _ld_1;
  int _jj_1;
  int _ii_1;
  long _val_1;
  long *_ptr_1;
  Integer _jdx;
  Integer _idx;
  int _ld;
  int _jj;
  int _ii;
  int _val;
  int *_ptr;
  int type;
  void *vptr;
  int me;
  int grp;
  Integer jdim;
  Integer idim;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  Integer jdx;
  Integer idx;
  Integer j;
  Integer i;
  int local_sync_end;
  int local_sync_begin;
  Integer s_a;
  Integer handle;
  long in_stack_fffffffffffffc70;
  Integer in_stack_fffffffffffffc88;
  Integer in_stack_fffffffffffffc90;
  Integer in_stack_fffffffffffffc98;
  Integer in_stack_fffffffffffffca0;
  void *in_stack_fffffffffffffcb8;
  long lVar16;
  Integer in_stack_fffffffffffffcc0;
  long lVar17;
  Integer in_stack_fffffffffffffcc8;
  Integer in_stack_fffffffffffffcd0;
  long in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffef0;
  long local_a0;
  Integer *hi_00;
  Integer *in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  long local_68;
  long local_60;
  long local_40;
  long local_38;
  
  lVar12 = in_RDI + 1000;
  pnga_pgroup_nodeid((long)GA[lVar12].p_handle);
  iVar8 = _ga_sync_end;
  iVar7 = _ga_sync_begin;
  iVar9 = GA[lVar12].type;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar7 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffc70);
  }
  if (GA[lVar12].ndim != 2) {
    pnga_error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  if (in_RDX == 0) {
    hi_00 = (Integer *)GA[lVar12].dims[0];
  }
  else {
    hi_00 = (Integer *)GA[lVar12].dims[1];
  }
  IVar13 = pnga_sprs_array_create
                     (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                      in_stack_fffffffffffffc88);
  pnga_distribution(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                    hi_00);
  pnga_access_ptr(_ii_12,(Integer *)_jj_12,(Integer *)_ld_12,(void *)_idx_12,(Integer *)_jdx_12);
  if (in_RSI == 4) {
    iVar10 = (int)in_stack_ffffffffffffff88;
    iVar5 = (int)local_68;
    iVar6 = (int)local_60;
    if (iVar9 == 0x3e9) {
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          if ((*(int *)(local_a0 +
                       (long)(((int)local_38 - iVar5) +
                             ((int)local_40 - iVar6) * ((iVar10 - iVar5) + 1)) * 4) != 0) ||
             (local_38 == local_40)) {
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else if (iVar9 == 0x3ea) {
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          if ((*(long *)(local_a0 +
                        (long)(((int)local_38 - iVar5) +
                              ((int)local_40 - iVar6) * ((iVar10 - iVar5) + 1)) * 8) != 0) ||
             (local_38 == local_40)) {
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else if (iVar9 == 0x3f8) {
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          in_stack_fffffffffffffef0 =
               *(long *)(local_a0 +
                        (long)(((int)local_38 - iVar5) +
                              ((int)local_40 - iVar6) * ((iVar10 - iVar5) + 1)) * 8);
          if ((in_stack_fffffffffffffef0 != 0) || (local_38 == local_40)) {
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else if (iVar9 == 0x3eb) {
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          fVar1 = *(float *)(local_a0 +
                            (long)(((int)local_38 - iVar5) +
                                  ((int)local_40 - iVar6) * ((iVar10 - iVar5) + 1)) * 4);
          if (((fVar1 != 0.0) || (NAN(fVar1))) || (local_38 == local_40)) {
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else if (iVar9 == 0x3ec) {
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          dVar3 = *(double *)
                   (local_a0 +
                   (long)(((int)local_38 - iVar5) + ((int)local_40 - iVar6) * ((iVar10 - iVar5) + 1)
                         ) * 8);
          if (((dVar3 != 0.0) || (NAN(dVar3))) || (local_38 == local_40)) {
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else if (iVar9 == 0x3ee) {
      iVar9 = (iVar10 - iVar5) + 1;
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        iVar10 = (int)local_40 - iVar6;
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          iVar11 = (int)local_38 - iVar5;
          fVar1 = *(float *)(local_a0 + (long)((iVar11 + iVar10 * iVar9) * 2) * 4);
          fVar2 = *(float *)(local_a0 + (long)((iVar11 + iVar10 * iVar9) * 2 + 1) * 4);
          if (((fVar1 != 0.0) || (NAN(fVar1))) ||
             ((fVar2 != 0.0 || ((NAN(fVar2) || (local_38 == local_40)))))) {
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else if (iVar9 == 0x3ef) {
      iVar9 = (iVar10 - iVar5) + 1;
      for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
        iVar10 = (int)local_40 - iVar6;
        for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
          iVar11 = (int)local_38 - iVar5;
          dVar3 = *(double *)(local_a0 + (long)((iVar11 + iVar10 * iVar9) * 2) * 8);
          dVar4 = *(double *)(local_a0 + (long)((iVar11 + iVar10 * iVar9) * 2 + 1) * 8);
          if ((((dVar3 != 0.0) || (NAN(dVar3))) || (dVar4 != 0.0)) ||
             ((NAN(dVar4) || (local_38 == local_40)))) {
            in_stack_fffffffffffffe08 = local_40;
            lVar12 = local_38;
            if (in_RDX != 0) {
              in_stack_fffffffffffffe08 = local_38;
              lVar12 = local_40;
            }
            in_stack_fffffffffffffe10 = (char *)(lVar12 + -1);
            in_stack_fffffffffffffe08 = in_stack_fffffffffffffe08 + -1;
            pnga_sprs_array_add_element
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0
                       ,in_stack_fffffffffffffcb8);
          }
        }
      }
    }
    else {
      pnga_error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    }
  }
  else if (iVar9 == 0x3e9) {
    lVar12 = in_stack_ffffffffffffff88 - local_68;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        if ((*(int *)(local_a0 + ((local_38 - local_68) + (local_40 - local_60) * (lVar12 + 1)) * 4)
             != 0) || (local_38 == local_40)) {
          pnga_sprs_array_add_element
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  else if (iVar9 == 0x3ea) {
    lVar12 = in_stack_ffffffffffffff88 - local_68;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        if ((*(long *)(local_a0 + ((local_38 - local_68) + (local_40 - local_60) * (lVar12 + 1)) * 8
                      ) != 0) || (local_38 == local_40)) {
          pnga_sprs_array_add_element
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  else if (iVar9 == 0x3f8) {
    lVar12 = in_stack_ffffffffffffff88 - local_68;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        if ((*(long *)(local_a0 + ((local_38 - local_68) + (local_40 - local_60) * (lVar12 + 1)) * 8
                      ) != 0) || (local_38 == local_40)) {
          pnga_sprs_array_add_element
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  else if (iVar9 == 0x3eb) {
    lVar12 = in_stack_ffffffffffffff88 - local_68;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        fVar1 = *(float *)(local_a0 +
                          ((local_38 - local_68) + (local_40 - local_60) * (lVar12 + 1)) * 4);
        if (((fVar1 != 0.0) || (NAN(fVar1))) || (local_38 == local_40)) {
          pnga_sprs_array_add_element
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  else if (iVar9 == 0x3ec) {
    lVar12 = in_stack_ffffffffffffff88 - local_68;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        dVar3 = *(double *)
                 (local_a0 + ((local_38 - local_68) + (local_40 - local_60) * (lVar12 + 1)) * 8);
        if (((dVar3 != 0.0) || (NAN(dVar3))) || (local_38 == local_40)) {
          pnga_sprs_array_add_element
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  else if (iVar9 == 0x3ee) {
    lVar12 = (in_stack_ffffffffffffff88 - local_68) + 1;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      lVar14 = local_40 - local_60;
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        fVar1 = *(float *)(local_a0 + ((local_38 - local_68) + lVar14 * lVar12) * 8);
        fVar2 = *(float *)(local_a0 + 4 + ((local_38 - local_68) + lVar14 * lVar12) * 8);
        if (((fVar1 != 0.0) || (NAN(fVar1))) ||
           ((fVar2 != 0.0 || ((NAN(fVar2) || (local_38 == local_40)))))) {
          lVar16 = local_40;
          lVar17 = local_38;
          if (in_RDX != 0) {
            lVar16 = local_38;
            lVar17 = local_40;
          }
          pnga_sprs_array_add_element(lVar14,lVar12,lVar17 + -1,(void *)(lVar16 + -1));
        }
      }
    }
  }
  else if (iVar9 == 0x3ef) {
    lVar12 = (in_stack_ffffffffffffff88 - local_68) + 1;
    for (local_40 = local_60; local_40 <= in_stack_ffffffffffffff90; local_40 = local_40 + 1) {
      lVar14 = local_40 - local_60;
      for (local_38 = local_68; local_38 <= in_stack_ffffffffffffff88; local_38 = local_38 + 1) {
        dVar3 = *(double *)(local_a0 + ((local_38 - local_68) + lVar14 * lVar12) * 0x10);
        dVar4 = *(double *)(local_a0 + 8 + ((local_38 - local_68) + lVar14 * lVar12) * 0x10);
        if ((((dVar3 != 0.0) || (NAN(dVar3))) || (dVar4 != 0.0)) ||
           ((NAN(dVar4) || (local_38 == local_40)))) {
          in_stack_fffffffffffffc70 = local_40;
          if (in_RDX != 0) {
            in_stack_fffffffffffffc70 = local_38;
          }
          in_stack_fffffffffffffc70 = in_stack_fffffffffffffc70 + -1;
          pnga_sprs_array_add_element
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  else {
    pnga_error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  pnga_mask_sync((long)iVar7,(long)iVar8);
  lVar15 = pnga_sprs_array_assemble(in_stack_fffffffffffffef0);
  if (lVar15 == 0) {
    pnga_error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  if (iVar8 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffc70);
  }
  return IVar13;
}

Assistant:

Integer pnga_sprs_array_create_from_dense(Integer g_a, Integer idx_size,
    Integer trans)
{
  Integer handle = g_a + GA_OFFSET, s_a;
  int local_sync_begin,local_sync_end;
  Integer i, j, idx, jdx, lo[2], hi[2], ld;
  Integer idim, jdim;
  int grp = GA[handle].p_handle;
  int me = (int)pnga_pgroup_nodeid(grp);
  void *vptr;
  int type = GA[handle].type;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* Check dimension */
  if (GA[handle].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array"
        " must be of dimension 2",0);
  }
  if (trans) {
    idim = (Integer)GA[handle].dims[1];
    jdim = (Integer)GA[handle].dims[0];
  } else {
    idim = (Integer)GA[handle].dims[0];
    jdim = (Integer)GA[handle].dims[1];
  }

  /* create sparse array */
  s_a = pnga_sprs_array_create(idim, jdim, type, idx_size);
  /* find bounding indices of locally owned block from global array */
  pnga_distribution(g_a,me,lo,hi);
  /* get pointer to locally owned block */
  pnga_access_ptr(g_a, lo, hi, &vptr, &ld);
  /* add all non-zero entries from g_a to s_a. Add diagonal elements
   * to s_a even if they are zero */
  if (idx_size == 4) {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  } else {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int64_t,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int64_t,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int64_t,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int64_t,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int64_t,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_sprs_array_assemble(s_a)) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create"
        " sparse array from dense array",0);
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_a;
}